

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::EndOfFiles(ParsedScene *this)

{
  bool bVar1;
  SceneRepresentation *in_RDI;
  vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  *unaff_retaddr;
  char *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  
  if (*(int *)&in_RDI[0x86]._vptr_SceneRepresentation != 1) {
    SceneRepresentation::ErrorExitDeferred<>(in_RDI,in_stack_ffffffffffffffe8);
  }
  while (bVar1 = std::
                 vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                 ::empty(unaff_retaddr), ((bVar1 ^ 0xffU) & 1) != 0) {
    SceneRepresentation::ErrorExitDeferred<>(in_RDI,in_stack_ffffffffffffffe8);
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::pop_back((vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                *)0x9ccf1a);
    std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::pop_back
              ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)0x9ccf2b);
  }
  while (bVar1 = std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::empty
                           ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)
                            unaff_retaddr), ((bVar1 ^ 0xffU) & 1) != 0) {
    SceneRepresentation::ErrorExitDeferred<>(in_RDI,in_stack_ffffffffffffffe8);
    std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::pop_back
              ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)0x9ccf6a);
  }
  if ((in_RDI->errorExit & 1U) == 0) {
    return;
  }
  ErrorExit<>(in_stack_00000020);
}

Assistant:

void ParsedScene::EndOfFiles() {
    if (currentApiState != APIState::WorldBlock)
        ErrorExitDeferred("End of files before \"WorldBegin\".");

    // Ensure there are no pushed graphics states
    while (!pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        pushedGraphicsStates.pop_back();
        pushedTransforms.pop_back();
    }
    while (!pushedTransforms.empty()) {
        ErrorExitDeferred("Missing end to TransformBegin");
        pushedTransforms.pop_back();
    }

    if (errorExit)
        ErrorExit("Fatal errors during scene construction");
}